

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_lswx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_3;
  TCGv_i64 EA;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  if (ctx->le_mode == true) {
    gen_align_no_le(ctx);
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  gen_set_access_type(ctx,0x20);
  EA = tcg_temp_new_i64(tcg_ctx);
  gen_addr_reg_index(ctx,EA);
  pTVar1 = tcg_const_i32_ppc64(tcg_ctx,ctx->opcode >> 0x15 & 0x1f);
  pTVar2 = tcg_const_i32_ppc64(tcg_ctx,*(ushort *)((long)&ctx->opcode + 2) & 0x1f);
  pTVar3 = tcg_const_i32_ppc64(tcg_ctx,ctx->opcode >> 0xb & 0x1f);
  local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_50 = (TCGTemp *)(EA + (long)tcg_ctx);
  local_48 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,helper_lswx_ppc64,(TCGTemp *)0x0,5,&local_58);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_lswx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv_i32 t1, t2, t3;

    if (ctx->le_mode) {
        gen_align_no_le(ctx);
        return;
    }
    gen_set_access_type(ctx, ACCESS_INT);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    t1 = tcg_const_i32(tcg_ctx, rD(ctx->opcode));
    t2 = tcg_const_i32(tcg_ctx, rA(ctx->opcode));
    t3 = tcg_const_i32(tcg_ctx, rB(ctx->opcode));
    gen_helper_lswx(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2, t3);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
}